

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathsimplifier.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_d7297f::PathSimplifier::removeIntersections(PathSimplifier *this)

{
  bool bVar1;
  long lVar2;
  qsizetype qVar3;
  QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *this_00;
  QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *__ptr;
  BVHNode *pBVar4;
  Element **ppEVar5;
  long in_RDI;
  long in_FS_OFFSET;
  BVHNode *node;
  Element *element;
  int i_1;
  int i;
  QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> elements;
  Element **in_stack_ffffffffffffff98;
  QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffc8;
  int nodeCount;
  Element *pEVar6;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar7;
  QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.capacity = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_20.siz = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_20.buffer = (Element **)&DAT_aaaaaaaaaaaaaaaa;
  QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::size
            ((QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)(in_RDI + 8));
  QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::QDataBuffer
            (in_stack_ffffffffffffffa0,(qsizetype)in_stack_ffffffffffffff98);
  iVar7 = 0;
  while( true ) {
    lVar2 = (long)iVar7;
    qVar3 = QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::size
                      ((QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)(in_RDI + 8)
                      );
    nodeCount = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
    if (qVar3 <= lVar2) break;
    QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::at
              ((QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)(in_RDI + 8),
               (long)iVar7);
    QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::add
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    iVar7 = iVar7 + 1;
  }
  this_00 = (QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)(in_RDI + 0x28);
  QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::size
            ((QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)(in_RDI + 8));
  BoundingVolumeHierarchy::allocate
            ((BoundingVolumeHierarchy *)CONCAT44(iVar7,in_stack_ffffffffffffffd0),nodeCount);
  __ptr = (QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)
          QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::data(&local_20);
  QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::size(&local_20);
  pBVar4 = buildTree((PathSimplifier *)elements.siz,(Element **)elements.capacity,this._4_4_);
  *(BVHNode **)(in_RDI + 0x28) = pBVar4;
  QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::reset(&local_20);
  iVar7 = 0;
  while( true ) {
    ppEVar5 = (Element **)(long)iVar7;
    qVar3 = QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::size
                      ((QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)(in_RDI + 8)
                      );
    if (qVar3 <= (long)ppEVar5) break;
    __ptr = (QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)
            QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::at
                      ((QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)(in_RDI + 8)
                       ,(long)iVar7);
    QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::add(this_00,ppEVar5);
    iVar7 = iVar7 + 1;
  }
  while (bVar1 = QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::isEmpty(&local_20),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    ppEVar5 = QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::last(&local_20);
    pEVar6 = *ppEVar5;
    QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::pop_back(&local_20);
    if ((*(ushort *)&pEVar6->field_0x38 >> 8 & 1) == 0) {
      __ptr = &local_20;
      bVar1 = intersectNodes((PathSimplifier *)elements.capacity,
                             (QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)this,
                             _i_1,(BVHNode *)element);
      if (!bVar1) {
        *(ushort *)&pEVar6->field_0x38 = *(ushort *)&pEVar6->field_0x38 & 0xfeff | 0x100;
      }
    }
  }
  BoundingVolumeHierarchy::free((BoundingVolumeHierarchy *)(in_RDI + 0x28),__ptr);
  QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::~QDataBuffer(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PathSimplifier::removeIntersections()
{
    Q_ASSERT(!m_elements.isEmpty());
    QDataBuffer<Element *> elements(m_elements.size());
    for (int i = 0; i < m_elements.size(); ++i)
        elements.add(m_elements.at(i));
    m_bvh.allocate(2 * m_elements.size());
    m_bvh.root = buildTree(elements.data(), elements.size());

    elements.reset();
    for (int i = 0; i < m_elements.size(); ++i)
        elements.add(m_elements.at(i));

    while (!elements.isEmpty()) {
        Element *element = elements.last();
        elements.pop_back();
        BVHNode *node = element->bvhNode;
        Q_ASSERT(node->type == BVHNode::Leaf);
        Q_ASSERT(node->element == element);
        if (!element->processed) {
            if (!intersectNodes(elements, node, m_bvh.root))
                element->processed = true;
        }
    }

    m_bvh.free(); // The bounding volume hierarchy is not needed anymore.
}